

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerResults.cpp
# Opt level: O0

void __thiscall
AsyncRgbLedAnalyzerResults::GenerateExportFile
          (AsyncRgbLedAnalyzerResults *this,char *file,DisplayBase display_base,
          U32 export_type_user_id)

{
  U8 bitSize;
  byte bVar1;
  uint uVar2;
  ulonglong uVar3;
  ostream *poVar4;
  ulong uVar5;
  bool bVar6;
  char local_343 [8];
  char webBuf [8];
  U8 webColor [3];
  char bs [16];
  char gs [16];
  char rs [16];
  size_t bufSize;
  RGBValue rgb;
  char time_str [128];
  U64 packetId;
  Frame frame;
  U64 local_260;
  ulonglong local_258;
  ulong local_248;
  U64 i;
  U64 num_frames;
  U32 sample_rate;
  U64 trigger_sample;
  ofstream file_stream;
  U32 export_type_user_id_local;
  DisplayBase display_base_local;
  char *file_local;
  AsyncRgbLedAnalyzerResults *this_local;
  
  std::ofstream::ofstream(&trigger_sample,file,_S_out);
  uVar3 = Analyzer::GetTriggerSample();
  uVar2 = Analyzer::GetSampleRate();
  poVar4 = std::operator<<((ostream *)&trigger_sample,
                           "Time [s], Packet ID, LED Index, Red, Green, Blue, Web-CSS");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  uVar5 = AnalyzerResults::GetNumFrames();
  for (local_248 = 0; local_248 < uVar5; local_248 = local_248 + 1) {
    AnalyzerResults::GetFrame((ulonglong)&packetId);
    time_str._120_8_ = AnalyzerResults::GetPacketContainingFrameSequential((ulonglong)this);
    if (time_str._120_8_ == -1) {
      time_str[0x78] = -1;
      time_str[0x79] = -1;
      time_str[0x7a] = -1;
      time_str[0x7b] = -1;
      time_str[0x7c] = -1;
      time_str[0x7d] = -1;
      time_str[0x7e] = -1;
      time_str[0x7f] = -1;
    }
    AnalyzerHelpers::GetTimeString(packetId,uVar3,uVar2,(char *)&rgb,0x80);
    bufSize = (size_t)RGBValue::CreateFromU64(local_260);
    GenerateRGBStrings(this,(RGBValue *)&bufSize,display_base,0x10,gs + 8,bs + 8,webBuf + 3);
    bitSize = AsyncRgbLedAnalyzerSettings::BitSize(this->mSettings);
    RGBValue::ConvertTo8Bit((RGBValue *)&bufSize,bitSize,(U8 *)webBuf);
    snprintf(local_343,8,"#%02x%02x%02x",(ulong)(byte)webBuf[0],(ulong)(byte)webBuf[1],
             (ulong)(byte)webBuf[2]);
    poVar4 = std::operator<<((ostream *)&trigger_sample,(char *)&rgb);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,time_str._120_8_);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_258);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = std::operator<<(poVar4,gs + 8);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = std::operator<<(poVar4,bs + 8);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = std::operator<<(poVar4,webBuf + 3);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = std::operator<<(poVar4,local_343);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    bVar1 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,local_248);
    bVar6 = (bVar1 & 1) == 1;
    if (bVar6) {
      std::ofstream::close();
    }
    Frame::~Frame((Frame *)&packetId);
    if (bVar6) goto LAB_00110de3;
  }
  std::ofstream::close();
LAB_00110de3:
  std::ofstream::~ofstream(&trigger_sample);
  return;
}

Assistant:

void AsyncRgbLedAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    file_stream << "Time [s], Packet ID, LED Index, Red, Green, Blue, Web-CSS" << std::endl;

    const U64 num_frames = GetNumFrames();

    for( U64 i = 0; i < num_frames; i++ )
    {
        const Frame frame = GetFrame( i );
        U64 packetId = GetPacketContainingFrameSequential( num_frames );

        if( packetId == INVALID_RESULT_INDEX )
        {
            packetId = -1;
        }

        char time_str[ 128 ];
        AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );

        RGBValue rgb = RGBValue::CreateFromU64( frame.mData1 );

        // RGB numerical value representation
        const size_t bufSize = 16;
        char rs[ bufSize ], gs[ bufSize ], bs[ bufSize ];
        GenerateRGBStrings( rgb, display_base, bufSize, rs, gs, bs );

        // CSS representation
        U8 webColor[ 3 ];
        rgb.ConvertTo8Bit( mSettings->BitSize(), webColor );
        char webBuf[ 8 ];
        ::snprintf( webBuf, sizeof( webBuf ), "#%02x%02x%02x", webColor[ 0 ], webColor[ 1 ], webColor[ 2 ] );

        file_stream << time_str << "," << packetId << "," << frame.mData2 << "," << rs << "," << gs << "," << bs << "," << webBuf
                    << std::endl;

        if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
        {
            file_stream.close();
            return;
        }
    }

    file_stream.close();
}